

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5CursorFirst(Fts5FullTable *pTab,Fts5Cursor *pCsr,int bDesc)

{
  Fts5Expr *p;
  int iVar1;
  
  p = pCsr->pExpr;
  iVar1 = sqlite3Fts5ExprFirst(p,(Fts5Index *)pTab,pCsr->iFirstRowid,bDesc);
  pCsr->csrflags = (uint)(p->pRoot->bEof != 0) | pCsr->csrflags | 0x4e;
  return iVar1;
}

Assistant:

static int fts5CursorFirst(Fts5FullTable *pTab, Fts5Cursor *pCsr, int bDesc){
  int rc;
  Fts5Expr *pExpr = pCsr->pExpr;
  rc = sqlite3Fts5ExprFirst(pExpr, pTab->p.pIndex, pCsr->iFirstRowid, bDesc);
  if( sqlite3Fts5ExprEof(pExpr) ){
    CsrFlagSet(pCsr, FTS5CSR_EOF);
  }
  fts5CsrNewrow(pCsr);
  return rc;
}